

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O3

err_t RenderDataInt(ebml_integer *Element,stream *Output,bool_t bForceWithoutMandatory,
                   bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  err_t eVar5;
  long lVar6;
  long lVar7;
  uint8_t FinalData [8];
  undefined8 local_38;
  undefined1 local_30 [8];
  
  if (((Element->Base).SizeLength < '\t') && (lVar7 = (Element->Base).DataSize, lVar7 != 0)) {
    uVar2 = Element->Value;
    iVar1 = (Element->Base).DefaultSize;
    lVar6 = (long)iVar1;
    lVar4 = lVar7;
    if (lVar7 < lVar6) {
      iVar3 = ~(uint)lVar7 + iVar1;
      if (iVar3 != 0) {
        memset(local_30,0,(long)iVar3);
      }
      lVar4 = (long)(int)(iVar1 - (uint)lVar7);
    }
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      local_30[lVar4 + -1] = (char)uVar2;
      uVar2 = uVar2 >> 8;
    }
    local_38 = 0;
    if (lVar7 < lVar6) {
      lVar7 = lVar6;
      if (Output == (stream *)0x0) {
        __assert_fail("(const void*)(Output)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                      ,0x9b,
                      "err_t RenderDataInt(ebml_integer *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                     );
      }
    }
    else if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0x9d,
                    "err_t RenderDataInt(ebml_integer *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    eVar5 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,local_30,lVar7,&local_38);
    if (Rendered != (filepos_t *)0x0) {
      *Rendered = local_38;
    }
  }
  else {
    eVar5 = 0;
  }
  return eVar5;
}

Assistant:

static err_t RenderDataInt(ebml_integer *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    uint8_t FinalData[8]; // we don't handle more than 64 bits integers
    size_t i;
    uint64_t TempValue = Element->Value;
    err_t Err;

    if (Element->Base.SizeLength > EBML_MAX_SIZE)
        return 0; // integers larger than 64 bits are not supported

    if (Element->Base.DataSize == 0)
        return 0; // nothing to write

    TempValue = Element->Value;
    if (Element->Base.DefaultSize > Element->Base.DataSize)
    {
        for (i=Element->Base.DefaultSize - (int)Element->Base.DataSize - 1;i;--i)
            FinalData[i-1] = 0;
        i = Element->Base.DefaultSize - (int)Element->Base.DataSize;
    }
    else
        i=(size_t)Element->Base.DataSize;
    for (;i;--i) {
        FinalData[i-1] = (uint8_t)(TempValue & 0xFF);
        TempValue >>= 8;
    }

    if (Element->Base.DefaultSize > Element->Base.DataSize)
        Err = Stream_Write(Output,FinalData,(size_t)Element->Base.DefaultSize,&i);
    else
        Err = Stream_Write(Output,FinalData,(size_t)Element->Base.DataSize,&i);
    if (Rendered)
        *Rendered = i;
    return Err;
}